

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_ManSetInitRefs(Gia_Man_t *p,Vec_Flt_t *vRefs)

{
  Gia_Obj_t *pGVar1;
  Vec_Flt_t *pVVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_3c;
  Gia_Obj_t *pGStack_38;
  int i;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Vec_Flt_t *vRefs_local;
  Gia_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)vRefs;
  vRefs_local = (Vec_Flt_t *)p;
  iVar3 = Gia_ManObjNum(p);
  Vec_FltFill(vRefs,iVar3,0.0);
  local_3c = 0;
  while( true ) {
    bVar6 = false;
    if (local_3c < *(int *)&vRefs_local[1].pArray) {
      pCtrl = Gia_ManObj((Gia_Man_t *)vRefs_local,local_3c);
      bVar6 = pCtrl != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(pCtrl);
    pGVar1 = pObj;
    if (iVar3 != 0) {
      iVar3 = Gia_ObjFaninId0(pCtrl,local_3c);
      Vec_FltAddToEntry((Vec_Flt_t *)pGVar1,iVar3,1.0);
      pGVar1 = pObj;
      iVar3 = Gia_ObjFaninId1(pCtrl,local_3c);
      Vec_FltAddToEntry((Vec_Flt_t *)pGVar1,iVar3,1.0);
      iVar3 = Gia_ObjIsMuxType(pCtrl);
      if (iVar3 != 0) {
        pData0 = Gia_ObjRecognizeMux(pCtrl,&stack0xffffffffffffffc8,&pData1);
        pVVar2 = vRefs_local;
        pGVar1 = pObj;
        pGVar4 = Gia_Regular(pData0);
        iVar3 = Gia_ObjId((Gia_Man_t *)pVVar2,pGVar4);
        Vec_FltAddToEntry((Vec_Flt_t *)pGVar1,iVar3,-1.0);
        pGVar4 = Gia_Regular(pData1);
        pGVar5 = Gia_Regular(pGStack_38);
        pVVar2 = vRefs_local;
        pGVar1 = pObj;
        if (pGVar4 == pGVar5) {
          pGVar4 = Gia_Regular(pData1);
          iVar3 = Gia_ObjId((Gia_Man_t *)pVVar2,pGVar4);
          Vec_FltAddToEntry((Vec_Flt_t *)pGVar1,iVar3,-1.0);
        }
      }
    }
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    iVar3 = Vec_IntSize((Vec_Int_t *)vRefs_local[4].pArray);
    bVar6 = false;
    if (local_3c < iVar3) {
      pCtrl = Gia_ManCo((Gia_Man_t *)vRefs_local,local_3c);
      bVar6 = pCtrl != (Gia_Obj_t *)0x0;
    }
    pGVar4 = pObj;
    pGVar1 = pCtrl;
    if (!bVar6) break;
    iVar3 = Gia_ObjId((Gia_Man_t *)vRefs_local,pCtrl);
    iVar3 = Gia_ObjFaninId0(pGVar1,iVar3);
    Vec_FltAddToEntry((Vec_Flt_t *)pGVar4,iVar3,1.0);
    local_3c = local_3c + 1;
  }
  for (local_3c = 0; iVar3 = Gia_ManObjNum((Gia_Man_t *)vRefs_local), local_3c < iVar3;
      local_3c = local_3c + 1) {
    Vec_FltUpdateEntry((Vec_Flt_t *)pObj,local_3c,1.0);
  }
  return;
}

Assistant:

void Kf_ManSetInitRefs( Gia_Man_t * p, Vec_Flt_t * vRefs )
{
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; int i;
    Vec_FltFill( vRefs, Gia_ManObjNum(p), 0 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, i), 1 );
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId1(pObj, i), 1 );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pCtrl)), -1 );
        if ( Gia_Regular(pData0) == Gia_Regular(pData1) )
            Vec_FltAddToEntry( vRefs, Gia_ObjId(p, Gia_Regular(pData0)), -1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltAddToEntry( vRefs, Gia_ObjFaninId0(pObj, Gia_ObjId(p, pObj)), 1 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Vec_FltUpdateEntry( vRefs, i, 1 );
}